

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servnotf.cpp
# Opt level: O0

void __thiscall
icu_63::ICUNotifier::addListener(ICUNotifier *this,EventListener *l,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int32_t iVar3;
  UVector *this_00;
  EventListener *pEVar4;
  undefined1 *size;
  UVector *local_70;
  EventListener *el;
  int32_t local_48;
  int e;
  int i;
  Mutex local_28;
  Mutex lmx;
  UErrorCode *status_local;
  EventListener *l_local;
  ICUNotifier *this_local;
  
  lmx.fMutex = (UMutex *)status;
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    if (l == (EventListener *)0x0) {
      ((lmx.fMutex)->fMutex).__data.__lock = 1;
    }
    else {
      iVar2 = (*this->_vptr_ICUNotifier[5])(this,l);
      if ((char)iVar2 != '\0') {
        size = notifyLock;
        Mutex::Mutex(&local_28,(UMutex *)notifyLock);
        if (this->listeners == (UVector *)0x0) {
          this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)size);
          local_70 = (UVector *)0x0;
          if (this_00 != (UVector *)0x0) {
            UVector::UVector(this_00,5,(UErrorCode *)lmx.fMutex);
            local_70 = this_00;
          }
          this->listeners = local_70;
        }
        else {
          local_48 = 0;
          iVar3 = UVector::size(this->listeners);
          for (; local_48 < iVar3; local_48 = local_48 + 1) {
            pEVar4 = (EventListener *)UVector::elementAt(this->listeners,local_48);
            if (l == pEVar4) goto LAB_001bcac6;
          }
        }
        UVector::addElement(this->listeners,l,(UErrorCode *)lmx.fMutex);
LAB_001bcac6:
        Mutex::~Mutex(&local_28);
      }
    }
  }
  return;
}

Assistant:

void 
ICUNotifier::addListener(const EventListener* l, UErrorCode& status) 
{
    if (U_SUCCESS(status)) {
        if (l == NULL) {
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return;
        }

        if (acceptsListener(*l)) {
            Mutex lmx(&notifyLock);
            if (listeners == NULL) {
                listeners = new UVector(5, status);
            } else {
                for (int i = 0, e = listeners->size(); i < e; ++i) {
                    const EventListener* el = (const EventListener*)(listeners->elementAt(i));
                    if (l == el) {
                        return;
                    }
                }
            }

            listeners->addElement((void*)l, status); // cast away const
        }
#ifdef NOTIFIER_DEBUG
        else {
            fprintf(stderr, "Listener invalid for this notifier.");
            exit(1);
        }
#endif
    }
}